

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O0

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  U32 UVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  U32 *pUVar6;
  BYTE *pBVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  U32 UVar11;
  U32 UVar12;
  U32 UVar13;
  uint uVar14;
  U32 UVar15;
  U32 UVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  BYTE *pBVar19;
  BYTE *pBVar20;
  long lVar21;
  size_t sVar22;
  BYTE *pBVar23;
  ulong uVar24;
  bool bVar25;
  U32 local_ca4;
  U32 local_ca0;
  U32 local_c2c;
  U32 local_c28;
  U32 local_bb4;
  U32 local_bb0;
  U32 local_b3c;
  U32 local_b38;
  U32 mls;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  U32 tmpOff_3;
  size_t rLength_3;
  size_t step_3;
  U32 offcode_3;
  BYTE *match1_3;
  BYTE *match0_3;
  BYTE *repMatch_3;
  U32 matchIndex1_3;
  U32 matchIndex0_3;
  U32 current1_3;
  U32 current0_3;
  U32 val1_3;
  size_t h1_3;
  U32 val0_3;
  size_t h0_3;
  BYTE *ip2_3;
  size_t mLength_3;
  U32 maxRep_3;
  U32 windowLow_3;
  U32 curr_3;
  U32 offsetSaved_3;
  U32 offset_2_3;
  U32 offset_1_3;
  BYTE *ilimit_3;
  BYTE *iend_3;
  BYTE *prefixStart_3;
  U32 prefixStartIndex_3;
  U32 endIndex_3;
  BYTE *anchor_3;
  BYTE *ip1_3;
  BYTE *ip0_3;
  BYTE *istart_3;
  BYTE *base_3;
  size_t stepSize_3;
  U32 hlog_3;
  U32 *hashTable_3;
  ZSTD_compressionParameters *cParams_3;
  size_t local_950;
  size_t local_938;
  size_t local_920;
  size_t local_908;
  size_t local_8f0;
  U32 tmpOff_2;
  size_t rLength_2;
  size_t step_2;
  U32 offcode_2;
  BYTE *match1_2;
  BYTE *match0_2;
  BYTE *repMatch_2;
  U32 matchIndex1_2;
  U32 matchIndex0_2;
  U32 current1_2;
  U32 current0_2;
  U32 val1_2;
  size_t h1_2;
  U32 val0_2;
  size_t h0_2;
  BYTE *ip2_2;
  size_t mLength_2;
  U32 maxRep_2;
  U32 windowLow_2;
  U32 curr_2;
  U32 offsetSaved_2;
  U32 offset_2_2;
  U32 offset_1_2;
  BYTE *ilimit_2;
  BYTE *iend_2;
  BYTE *prefixStart_2;
  U32 prefixStartIndex_2;
  U32 endIndex_2;
  BYTE *anchor_2;
  BYTE *ip1_2;
  BYTE *ip0_2;
  BYTE *istart_2;
  BYTE *base_2;
  size_t stepSize_2;
  U32 hlog_2;
  U32 *hashTable_2;
  ZSTD_compressionParameters *cParams_2;
  size_t local_7b0;
  size_t local_798;
  size_t local_780;
  size_t local_768;
  size_t local_750;
  U32 tmpOff_1;
  size_t rLength_1;
  size_t step_1;
  U32 offcode_1;
  BYTE *match1_1;
  BYTE *match0_1;
  BYTE *repMatch_1;
  U32 matchIndex1_1;
  U32 matchIndex0_1;
  U32 current1_1;
  U32 current0_1;
  U32 val1_1;
  size_t h1_1;
  U32 val0_1;
  size_t h0_1;
  BYTE *ip2_1;
  size_t mLength_1;
  U32 maxRep_1;
  U32 windowLow_1;
  U32 curr_1;
  U32 offsetSaved_1;
  U32 offset_2_1;
  U32 offset_1_1;
  BYTE *ilimit_1;
  BYTE *iend_1;
  BYTE *prefixStart_1;
  U32 prefixStartIndex_1;
  U32 endIndex_1;
  BYTE *anchor_1;
  BYTE *ip1_1;
  BYTE *ip0_1;
  BYTE *istart_1;
  BYTE *base_1;
  size_t stepSize_1;
  U32 hlog_1;
  U32 *hashTable_1;
  ZSTD_compressionParameters *cParams_1;
  size_t local_610;
  size_t local_5f8;
  size_t local_5e0;
  size_t local_5c8;
  size_t local_5b0;
  U32 tmpOff;
  size_t rLength;
  size_t step;
  U32 offcode;
  BYTE *match1;
  BYTE *match0;
  BYTE *repMatch;
  U32 matchIndex1;
  U32 matchIndex0;
  U32 current1;
  U32 current0;
  U32 val1;
  size_t h1;
  U32 val0;
  size_t h0;
  BYTE *ip2;
  size_t mLength;
  U32 maxRep;
  U32 windowLow;
  U32 curr;
  U32 offsetSaved;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *prefixStart;
  U32 prefixStartIndex;
  U32 endIndex;
  BYTE *anchor;
  BYTE *ip1;
  BYTE *ip0;
  BYTE *istart;
  BYTE *base;
  size_t stepSize;
  U32 hlog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  size_t local_470;
  size_t local_458;
  size_t local_440;
  size_t local_428;
  size_t local_410;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *litEnd_3;
  BYTE *litLimit_w_3;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  BYTE *litEnd_5;
  BYTE *litLimit_w_5;
  BYTE *litEnd_4;
  BYTE *litLimit_w_4;
  BYTE *litEnd_7;
  BYTE *litLimit_w_7;
  BYTE *litEnd_6;
  BYTE *litLimit_w_6;
  BYTE *oend_6;
  BYTE *op_6;
  BYTE *ip_6;
  ptrdiff_t diff_6;
  BYTE *oend_7;
  BYTE *op_7;
  BYTE *ip_7;
  ptrdiff_t diff_7;
  BYTE *oend_4;
  BYTE *op_4;
  BYTE *ip_4;
  ptrdiff_t diff_4;
  BYTE *oend_5;
  BYTE *op_5;
  BYTE *ip_5;
  ptrdiff_t diff_5;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_2;
  ptrdiff_t diff_2;
  BYTE *oend_3;
  BYTE *op_3;
  BYTE *ip_3;
  ptrdiff_t diff_3;
  BYTE *oend;
  BYTE *op;
  BYTE *ip;
  ptrdiff_t diff;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_1;
  ptrdiff_t diff_1;
  
  iVar8 = (int)srcSize;
  iVar9 = (int)src;
  switch((ms->cParams).minMatch) {
  default:
    pUVar6 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar2 = (ms->cParams).targetLength;
    uVar3 = (ms->cParams).targetLength;
    pBVar7 = (ms->window).base;
    iVar10 = (int)pBVar7;
    UVar11 = ZSTD_getLowestPrefixIndex(ms,(iVar9 - iVar10) + iVar8,(ms->cParams).windowLog);
    pBVar17 = (BYTE *)((long)src + srcSize);
    pBVar18 = pBVar17 + -8;
    uVar4 = *rep;
    uVar5 = rep[1];
    windowLow = 0;
    ip1 = (BYTE *)((long)src + (long)(int)(uint)((BYTE *)src == pBVar7 + UVar11));
    anchor = ip1 + 1;
    UVar12 = (int)ip1 - iVar10;
    UVar13 = ZSTD_getLowestPrefixIndex(ms,UVar12,(ms->cParams).windowLog);
    uVar14 = UVar12 - UVar13;
    curr = uVar5;
    if (uVar14 < uVar5) {
      curr = 0;
      windowLow = uVar5;
    }
    offsetSaved = uVar4;
    _prefixStartIndex = (BYTE *)src;
    if (uVar14 < uVar4) {
      offsetSaved = 0;
      windowLow = uVar4;
    }
    while (anchor < pBVar18) {
      pBVar19 = ip1 + 2;
      switch(0x26ec44) {
      case 0:
        local_410 = ZSTD_hash4Ptr(ip1,UVar1);
        break;
      case 1:
        local_410 = ZSTD_hash5Ptr(ip1,UVar1);
        break;
      case 2:
        local_410 = ZSTD_hash6Ptr(ip1,UVar1);
        break;
      case 3:
        local_410 = ZSTD_hash7Ptr(ip1,UVar1);
        break;
      case 4:
        local_410 = ZSTD_hash8Ptr(ip1,UVar1);
      }
      UVar12 = MEM_read32(ip1);
      switch(0x26ed3f) {
      case 0:
        local_428 = ZSTD_hash4Ptr(anchor,UVar1);
        break;
      case 1:
        local_428 = ZSTD_hash5Ptr(anchor,UVar1);
        break;
      case 2:
        local_428 = ZSTD_hash6Ptr(anchor,UVar1);
        break;
      case 3:
        local_428 = ZSTD_hash7Ptr(anchor,UVar1);
        break;
      case 4:
        local_428 = ZSTD_hash8Ptr(anchor,UVar1);
      }
      UVar13 = MEM_read32(anchor);
      uVar14 = (int)ip1 - iVar10;
      uVar4 = pUVar6[local_410];
      uVar5 = pUVar6[local_428];
      pBVar20 = pBVar19 + -(ulong)offsetSaved;
      match1 = pBVar7 + uVar4;
      pUVar6[local_410] = uVar14;
      pUVar6[local_428] = (int)anchor - iVar10;
      UVar15 = MEM_read32(pBVar20);
      UVar16 = MEM_read32(pBVar19);
      if (offsetSaved == 0 || UVar15 != UVar16) {
        if ((UVar11 < uVar4) && (UVar15 = MEM_read32(match1), UVar15 == UVar12)) {
LAB_0026f04a:
          curr = offsetSaved;
          offsetSaved = (int)ip1 - (int)match1;
          step._4_4_ = offsetSaved + 2;
          ip2 = (BYTE *)0x4;
          while( true ) {
            bVar25 = false;
            if (_prefixStartIndex < ip1 && pBVar7 + UVar11 < match1) {
              bVar25 = ip1[-1] == match1[-1];
            }
            if (!bVar25) break;
            ip1 = ip1 + -1;
            match1 = match1 + -1;
            ip2 = ip2 + 1;
          }
          goto LAB_0026f12c;
        }
        if ((UVar11 < uVar5) && (UVar12 = MEM_read32(pBVar7 + uVar5), UVar12 == UVar13)) {
          ip1 = anchor;
          match1 = pBVar7 + uVar5;
          goto LAB_0026f04a;
        }
        lVar21 = ((ulong)((long)ip1 - (long)_prefixStartIndex) >> 7) +
                 (ulong)(uVar2 + ((uVar3 != 0 ^ 0xffU) & 1) + 1);
        ip1 = ip1 + lVar21;
        anchor = anchor + lVar21;
      }
      else {
        lVar21 = (long)(int)(uint)(ip1[1] == pBVar20[-1]);
        ip1 = pBVar19 + -lVar21;
        match1 = pBVar20 + -lVar21;
        ip2 = (BYTE *)(lVar21 + 4);
        step._4_4_ = 0;
LAB_0026f12c:
        sVar22 = ZSTD_count(ip1 + (long)ip2,match1 + (long)ip2,pBVar17);
        pBVar19 = ip2 + sVar22;
        uVar24 = (long)ip1 - (long)_prefixStartIndex;
        if (pBVar17 + -0x20 < _prefixStartIndex + uVar24) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_prefixStartIndex,_prefixStartIndex + uVar24,pBVar17 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_prefixStartIndex);
          if (0x10 < uVar24) {
            pBVar20 = seqStore->lit;
            pBVar23 = pBVar20 + 0x10;
            ZSTD_copy16(pBVar23,_prefixStartIndex + 0x10);
            if (0x10 < (long)(uVar24 - 0x10)) {
              oend = pBVar20 + 0x20;
              do {
                op = _prefixStartIndex + 0x20;
                ZSTD_copy16(oend,op);
                ZSTD_copy16(oend + 0x10,_prefixStartIndex + 0x30);
                oend = oend + 0x20;
                _prefixStartIndex = op;
              } while (oend < pBVar23 + (uVar24 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar24;
        if (0xffff < uVar24) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar24;
        seqStore->sequences->offset = step._4_4_ + 1;
        if ((BYTE *)0xffff < pBVar19 + -3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(pBVar19 + -3);
        seqStore->sequences = seqStore->sequences + 1;
        ip1 = pBVar19 + (long)ip1;
        if (ip1 <= pBVar18) {
          pBVar19 = pBVar7 + (ulong)uVar14 + 2;
          switch(0x26f523) {
          case 0:
            local_440 = ZSTD_hash4Ptr(pBVar19,UVar1);
            break;
          case 1:
            local_440 = ZSTD_hash5Ptr(pBVar19,UVar1);
            break;
          case 2:
            local_440 = ZSTD_hash6Ptr(pBVar19,UVar1);
            break;
          case 3:
            local_440 = ZSTD_hash7Ptr(pBVar19,UVar1);
            break;
          case 4:
            local_440 = ZSTD_hash8Ptr(pBVar19,UVar1);
          }
          pUVar6[local_440] = uVar14 + 2;
          pBVar19 = ip1 + -2;
          switch(0x26f637) {
          case 0:
            local_458 = ZSTD_hash4Ptr(pBVar19,UVar1);
            break;
          case 1:
            local_458 = ZSTD_hash5Ptr(pBVar19,UVar1);
            break;
          case 2:
            local_458 = ZSTD_hash6Ptr(pBVar19,UVar1);
            break;
          case 3:
            local_458 = ZSTD_hash7Ptr(pBVar19,UVar1);
            break;
          case 4:
            local_458 = ZSTD_hash8Ptr(pBVar19,UVar1);
          }
          pUVar6[local_458] = (int)pBVar19 - iVar10;
          if (curr != 0) {
            while( true ) {
              UVar12 = curr;
              bVar25 = false;
              if (ip1 <= pBVar18) {
                UVar13 = MEM_read32(ip1);
                UVar15 = MEM_read32(ip1 + -(ulong)curr);
                bVar25 = UVar13 == UVar15;
              }
              if (!bVar25) break;
              sVar22 = ZSTD_count(ip1 + 4,ip1 + 4 + -(ulong)curr,pBVar17);
              curr = offsetSaved;
              offsetSaved = UVar12;
              switch(0x26f810) {
              case 0:
                local_470 = ZSTD_hash4Ptr(ip1,UVar1);
                break;
              case 1:
                local_470 = ZSTD_hash5Ptr(ip1,UVar1);
                break;
              case 2:
                local_470 = ZSTD_hash6Ptr(ip1,UVar1);
                break;
              case 3:
                local_470 = ZSTD_hash7Ptr(ip1,UVar1);
                break;
              case 4:
                local_470 = ZSTD_hash8Ptr(ip1,UVar1);
              }
              pUVar6[local_470] = (int)ip1 - iVar10;
              if (pBVar17 + -0x20 < ip1) {
                ZSTD_safecopyLiterals(seqStore->lit,ip1,ip1,pBVar17 + -0x20);
              }
              else {
                ZSTD_copy16(seqStore->lit,ip1);
              }
              seqStore->lit = seqStore->lit;
              seqStore->sequences->litLength = 0;
              seqStore->sequences->offset = 1;
              if (0xffff < sVar22 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->matchLength = (U16)(sVar22 + 1);
              seqStore->sequences = seqStore->sequences + 1;
              ip1 = ip1 + sVar22 + 4;
            }
          }
        }
        anchor = ip1 + 1;
        _prefixStartIndex = ip1;
      }
    }
    if (offsetSaved == 0) {
      local_b38 = windowLow;
    }
    else {
      local_b38 = offsetSaved;
    }
    *rep = local_b38;
    if (curr == 0) {
      local_b3c = windowLow;
    }
    else {
      local_b3c = curr;
    }
    rep[1] = local_b3c;
    ms_local = (ZSTD_matchState_t *)(pBVar17 + -(long)_prefixStartIndex);
    break;
  case 5:
    pUVar6 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar2 = (ms->cParams).targetLength;
    uVar3 = (ms->cParams).targetLength;
    pBVar7 = (ms->window).base;
    iVar10 = (int)pBVar7;
    UVar11 = ZSTD_getLowestPrefixIndex(ms,(iVar9 - iVar10) + iVar8,(ms->cParams).windowLog);
    pBVar17 = (BYTE *)((long)src + srcSize);
    pBVar18 = pBVar17 + -8;
    uVar4 = *rep;
    uVar5 = rep[1];
    windowLow_1 = 0;
    ip1_1 = (BYTE *)((long)src + (long)(int)(uint)((BYTE *)src == pBVar7 + UVar11));
    anchor_1 = ip1_1 + 1;
    UVar12 = (int)ip1_1 - iVar10;
    UVar13 = ZSTD_getLowestPrefixIndex(ms,UVar12,(ms->cParams).windowLog);
    uVar14 = UVar12 - UVar13;
    curr_1 = uVar5;
    if (uVar14 < uVar5) {
      curr_1 = 0;
      windowLow_1 = uVar5;
    }
    offsetSaved_1 = uVar4;
    _prefixStartIndex_1 = (BYTE *)src;
    if (uVar14 < uVar4) {
      offsetSaved_1 = 0;
      windowLow_1 = uVar4;
    }
    while (anchor_1 < pBVar18) {
      pBVar19 = ip1_1 + 2;
      switch(0x26ff6e) {
      case 0:
        local_5b0 = ZSTD_hash4Ptr(ip1_1,UVar1);
        break;
      case 1:
        local_5b0 = ZSTD_hash5Ptr(ip1_1,UVar1);
        break;
      case 2:
        local_5b0 = ZSTD_hash6Ptr(ip1_1,UVar1);
        break;
      case 3:
        local_5b0 = ZSTD_hash7Ptr(ip1_1,UVar1);
        break;
      case 4:
        local_5b0 = ZSTD_hash8Ptr(ip1_1,UVar1);
      }
      UVar12 = MEM_read32(ip1_1);
      switch(0x270069) {
      case 0:
        local_5c8 = ZSTD_hash4Ptr(anchor_1,UVar1);
        break;
      case 1:
        local_5c8 = ZSTD_hash5Ptr(anchor_1,UVar1);
        break;
      case 2:
        local_5c8 = ZSTD_hash6Ptr(anchor_1,UVar1);
        break;
      case 3:
        local_5c8 = ZSTD_hash7Ptr(anchor_1,UVar1);
        break;
      case 4:
        local_5c8 = ZSTD_hash8Ptr(anchor_1,UVar1);
      }
      UVar13 = MEM_read32(anchor_1);
      uVar14 = (int)ip1_1 - iVar10;
      uVar4 = pUVar6[local_5b0];
      uVar5 = pUVar6[local_5c8];
      pBVar20 = pBVar19 + -(ulong)offsetSaved_1;
      match1_1 = pBVar7 + uVar4;
      pUVar6[local_5b0] = uVar14;
      pUVar6[local_5c8] = (int)anchor_1 - iVar10;
      UVar15 = MEM_read32(pBVar20);
      UVar16 = MEM_read32(pBVar19);
      if (offsetSaved_1 == 0 || UVar15 != UVar16) {
        if ((UVar11 < uVar4) && (UVar15 = MEM_read32(match1_1), UVar15 == UVar12)) {
LAB_00270359:
          curr_1 = offsetSaved_1;
          offsetSaved_1 = (int)ip1_1 - (int)match1_1;
          step_1._4_4_ = offsetSaved_1 + 2;
          ip2_1 = (BYTE *)0x4;
          while( true ) {
            bVar25 = false;
            if (_prefixStartIndex_1 < ip1_1 && pBVar7 + UVar11 < match1_1) {
              bVar25 = ip1_1[-1] == match1_1[-1];
            }
            if (!bVar25) break;
            ip1_1 = ip1_1 + -1;
            match1_1 = match1_1 + -1;
            ip2_1 = ip2_1 + 1;
          }
          goto LAB_0027043b;
        }
        if ((UVar11 < uVar5) && (UVar12 = MEM_read32(pBVar7 + uVar5), UVar12 == UVar13)) {
          ip1_1 = anchor_1;
          match1_1 = pBVar7 + uVar5;
          goto LAB_00270359;
        }
        lVar21 = ((ulong)((long)ip1_1 - (long)_prefixStartIndex_1) >> 7) +
                 (ulong)(uVar2 + ((uVar3 != 0 ^ 0xffU) & 1) + 1);
        ip1_1 = ip1_1 + lVar21;
        anchor_1 = anchor_1 + lVar21;
      }
      else {
        lVar21 = (long)(int)(uint)(ip1_1[1] == pBVar20[-1]);
        ip1_1 = pBVar19 + -lVar21;
        match1_1 = pBVar20 + -lVar21;
        ip2_1 = (BYTE *)(lVar21 + 4);
        step_1._4_4_ = 0;
LAB_0027043b:
        sVar22 = ZSTD_count(ip1_1 + (long)ip2_1,match1_1 + (long)ip2_1,pBVar17);
        pBVar19 = ip2_1 + sVar22;
        uVar24 = (long)ip1_1 - (long)_prefixStartIndex_1;
        if (pBVar17 + -0x20 < _prefixStartIndex_1 + uVar24) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_prefixStartIndex_1,_prefixStartIndex_1 + uVar24,pBVar17 + -0x20)
          ;
        }
        else {
          ZSTD_copy16(seqStore->lit,_prefixStartIndex_1);
          if (0x10 < uVar24) {
            pBVar20 = seqStore->lit;
            pBVar23 = pBVar20 + 0x10;
            ZSTD_copy16(pBVar23,_prefixStartIndex_1 + 0x10);
            if (0x10 < (long)(uVar24 - 0x10)) {
              oend_2 = pBVar20 + 0x20;
              do {
                op_2 = _prefixStartIndex_1 + 0x20;
                ZSTD_copy16(oend_2,op_2);
                ZSTD_copy16(oend_2 + 0x10,_prefixStartIndex_1 + 0x30);
                oend_2 = oend_2 + 0x20;
                _prefixStartIndex_1 = op_2;
              } while (oend_2 < pBVar23 + (uVar24 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar24;
        if (0xffff < uVar24) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar24;
        seqStore->sequences->offset = step_1._4_4_ + 1;
        if ((BYTE *)0xffff < pBVar19 + -3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(pBVar19 + -3);
        seqStore->sequences = seqStore->sequences + 1;
        ip1_1 = pBVar19 + (long)ip1_1;
        if (ip1_1 <= pBVar18) {
          pBVar19 = pBVar7 + (ulong)uVar14 + 2;
          switch(0x2708d7) {
          case 0:
            local_5e0 = ZSTD_hash4Ptr(pBVar19,UVar1);
            break;
          case 1:
            local_5e0 = ZSTD_hash5Ptr(pBVar19,UVar1);
            break;
          case 2:
            local_5e0 = ZSTD_hash6Ptr(pBVar19,UVar1);
            break;
          case 3:
            local_5e0 = ZSTD_hash7Ptr(pBVar19,UVar1);
            break;
          case 4:
            local_5e0 = ZSTD_hash8Ptr(pBVar19,UVar1);
          }
          pUVar6[local_5e0] = uVar14 + 2;
          pBVar19 = ip1_1 + -2;
          switch(0x2709eb) {
          case 0:
            local_5f8 = ZSTD_hash4Ptr(pBVar19,UVar1);
            break;
          case 1:
            local_5f8 = ZSTD_hash5Ptr(pBVar19,UVar1);
            break;
          case 2:
            local_5f8 = ZSTD_hash6Ptr(pBVar19,UVar1);
            break;
          case 3:
            local_5f8 = ZSTD_hash7Ptr(pBVar19,UVar1);
            break;
          case 4:
            local_5f8 = ZSTD_hash8Ptr(pBVar19,UVar1);
          }
          pUVar6[local_5f8] = (int)pBVar19 - iVar10;
          if (curr_1 != 0) {
            while( true ) {
              UVar12 = curr_1;
              bVar25 = false;
              if (ip1_1 <= pBVar18) {
                UVar13 = MEM_read32(ip1_1);
                UVar15 = MEM_read32(ip1_1 + -(ulong)curr_1);
                bVar25 = UVar13 == UVar15;
              }
              if (!bVar25) break;
              sVar22 = ZSTD_count(ip1_1 + 4,ip1_1 + 4 + -(ulong)curr_1,pBVar17);
              curr_1 = offsetSaved_1;
              offsetSaved_1 = UVar12;
              switch(0x270bc4) {
              case 0:
                local_610 = ZSTD_hash4Ptr(ip1_1,UVar1);
                break;
              case 1:
                local_610 = ZSTD_hash5Ptr(ip1_1,UVar1);
                break;
              case 2:
                local_610 = ZSTD_hash6Ptr(ip1_1,UVar1);
                break;
              case 3:
                local_610 = ZSTD_hash7Ptr(ip1_1,UVar1);
                break;
              case 4:
                local_610 = ZSTD_hash8Ptr(ip1_1,UVar1);
              }
              pUVar6[local_610] = (int)ip1_1 - iVar10;
              if (pBVar17 + -0x20 < ip1_1) {
                ZSTD_safecopyLiterals(seqStore->lit,ip1_1,ip1_1,pBVar17 + -0x20);
              }
              else {
                ZSTD_copy16(seqStore->lit,ip1_1);
              }
              seqStore->lit = seqStore->lit;
              seqStore->sequences->litLength = 0;
              seqStore->sequences->offset = 1;
              if (0xffff < sVar22 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->matchLength = (U16)(sVar22 + 1);
              seqStore->sequences = seqStore->sequences + 1;
              ip1_1 = ip1_1 + sVar22 + 4;
            }
          }
        }
        anchor_1 = ip1_1 + 1;
        _prefixStartIndex_1 = ip1_1;
      }
    }
    if (offsetSaved_1 == 0) {
      local_bb0 = windowLow_1;
    }
    else {
      local_bb0 = offsetSaved_1;
    }
    *rep = local_bb0;
    if (curr_1 == 0) {
      local_bb4 = windowLow_1;
    }
    else {
      local_bb4 = curr_1;
    }
    rep[1] = local_bb4;
    ms_local = (ZSTD_matchState_t *)(pBVar17 + -(long)_prefixStartIndex_1);
    break;
  case 6:
    pUVar6 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar2 = (ms->cParams).targetLength;
    uVar3 = (ms->cParams).targetLength;
    pBVar7 = (ms->window).base;
    iVar10 = (int)pBVar7;
    UVar11 = ZSTD_getLowestPrefixIndex(ms,(iVar9 - iVar10) + iVar8,(ms->cParams).windowLog);
    pBVar17 = (BYTE *)((long)src + srcSize);
    pBVar18 = pBVar17 + -8;
    uVar4 = *rep;
    uVar5 = rep[1];
    windowLow_2 = 0;
    ip1_2 = (BYTE *)((long)src + (long)(int)(uint)((BYTE *)src == pBVar7 + UVar11));
    anchor_2 = ip1_2 + 1;
    UVar12 = (int)ip1_2 - iVar10;
    UVar13 = ZSTD_getLowestPrefixIndex(ms,UVar12,(ms->cParams).windowLog);
    uVar14 = UVar12 - UVar13;
    curr_2 = uVar5;
    if (uVar14 < uVar5) {
      curr_2 = 0;
      windowLow_2 = uVar5;
    }
    offsetSaved_2 = uVar4;
    _prefixStartIndex_2 = (BYTE *)src;
    if (uVar14 < uVar4) {
      offsetSaved_2 = 0;
      windowLow_2 = uVar4;
    }
    while (anchor_2 < pBVar18) {
      pBVar19 = ip1_2 + 2;
      switch(0x2713ac) {
      case 0:
        local_750 = ZSTD_hash4Ptr(ip1_2,UVar1);
        break;
      case 1:
        local_750 = ZSTD_hash5Ptr(ip1_2,UVar1);
        break;
      case 2:
        local_750 = ZSTD_hash6Ptr(ip1_2,UVar1);
        break;
      case 3:
        local_750 = ZSTD_hash7Ptr(ip1_2,UVar1);
        break;
      case 4:
        local_750 = ZSTD_hash8Ptr(ip1_2,UVar1);
      }
      UVar12 = MEM_read32(ip1_2);
      switch(0x2714a7) {
      case 0:
        local_768 = ZSTD_hash4Ptr(anchor_2,UVar1);
        break;
      case 1:
        local_768 = ZSTD_hash5Ptr(anchor_2,UVar1);
        break;
      case 2:
        local_768 = ZSTD_hash6Ptr(anchor_2,UVar1);
        break;
      case 3:
        local_768 = ZSTD_hash7Ptr(anchor_2,UVar1);
        break;
      case 4:
        local_768 = ZSTD_hash8Ptr(anchor_2,UVar1);
      }
      UVar13 = MEM_read32(anchor_2);
      uVar14 = (int)ip1_2 - iVar10;
      uVar4 = pUVar6[local_750];
      uVar5 = pUVar6[local_768];
      pBVar20 = pBVar19 + -(ulong)offsetSaved_2;
      match1_2 = pBVar7 + uVar4;
      pUVar6[local_750] = uVar14;
      pUVar6[local_768] = (int)anchor_2 - iVar10;
      UVar15 = MEM_read32(pBVar20);
      UVar16 = MEM_read32(pBVar19);
      if (offsetSaved_2 == 0 || UVar15 != UVar16) {
        if ((UVar11 < uVar4) && (UVar15 = MEM_read32(match1_2), UVar15 == UVar12)) {
LAB_0027177c:
          curr_2 = offsetSaved_2;
          offsetSaved_2 = (int)ip1_2 - (int)match1_2;
          step_2._4_4_ = offsetSaved_2 + 2;
          ip2_2 = (BYTE *)0x4;
          while( true ) {
            bVar25 = false;
            if (_prefixStartIndex_2 < ip1_2 && pBVar7 + UVar11 < match1_2) {
              bVar25 = ip1_2[-1] == match1_2[-1];
            }
            if (!bVar25) break;
            ip1_2 = ip1_2 + -1;
            match1_2 = match1_2 + -1;
            ip2_2 = ip2_2 + 1;
          }
          goto LAB_0027185e;
        }
        if ((UVar11 < uVar5) && (UVar12 = MEM_read32(pBVar7 + uVar5), UVar12 == UVar13)) {
          ip1_2 = anchor_2;
          match1_2 = pBVar7 + uVar5;
          goto LAB_0027177c;
        }
        lVar21 = ((ulong)((long)ip1_2 - (long)_prefixStartIndex_2) >> 7) +
                 (ulong)(uVar2 + ((uVar3 != 0 ^ 0xffU) & 1) + 1);
        ip1_2 = ip1_2 + lVar21;
        anchor_2 = anchor_2 + lVar21;
      }
      else {
        lVar21 = (long)(int)(uint)(ip1_2[1] == pBVar20[-1]);
        ip1_2 = pBVar19 + -lVar21;
        match1_2 = pBVar20 + -lVar21;
        ip2_2 = (BYTE *)(lVar21 + 4);
        step_2._4_4_ = 0;
LAB_0027185e:
        sVar22 = ZSTD_count(ip1_2 + (long)ip2_2,match1_2 + (long)ip2_2,pBVar17);
        pBVar19 = ip2_2 + sVar22;
        uVar24 = (long)ip1_2 - (long)_prefixStartIndex_2;
        if (pBVar17 + -0x20 < _prefixStartIndex_2 + uVar24) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_prefixStartIndex_2,_prefixStartIndex_2 + uVar24,pBVar17 + -0x20)
          ;
        }
        else {
          ZSTD_copy16(seqStore->lit,_prefixStartIndex_2);
          if (0x10 < uVar24) {
            pBVar20 = seqStore->lit;
            pBVar23 = pBVar20 + 0x10;
            ZSTD_copy16(pBVar23,_prefixStartIndex_2 + 0x10);
            if (0x10 < (long)(uVar24 - 0x10)) {
              oend_4 = pBVar20 + 0x20;
              do {
                op_4 = _prefixStartIndex_2 + 0x20;
                ZSTD_copy16(oend_4,op_4);
                ZSTD_copy16(oend_4 + 0x10,_prefixStartIndex_2 + 0x30);
                oend_4 = oend_4 + 0x20;
                _prefixStartIndex_2 = op_4;
              } while (oend_4 < pBVar23 + (uVar24 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar24;
        if (0xffff < uVar24) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar24;
        seqStore->sequences->offset = step_2._4_4_ + 1;
        if ((BYTE *)0xffff < pBVar19 + -3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(pBVar19 + -3);
        seqStore->sequences = seqStore->sequences + 1;
        ip1_2 = pBVar19 + (long)ip1_2;
        if (ip1_2 <= pBVar18) {
          pBVar19 = pBVar7 + (ulong)uVar14 + 2;
          switch(0x271d15) {
          case 0:
            local_780 = ZSTD_hash4Ptr(pBVar19,UVar1);
            break;
          case 1:
            local_780 = ZSTD_hash5Ptr(pBVar19,UVar1);
            break;
          case 2:
            local_780 = ZSTD_hash6Ptr(pBVar19,UVar1);
            break;
          case 3:
            local_780 = ZSTD_hash7Ptr(pBVar19,UVar1);
            break;
          case 4:
            local_780 = ZSTD_hash8Ptr(pBVar19,UVar1);
          }
          pUVar6[local_780] = uVar14 + 2;
          pBVar19 = ip1_2 + -2;
          switch(0x271e29) {
          case 0:
            local_798 = ZSTD_hash4Ptr(pBVar19,UVar1);
            break;
          case 1:
            local_798 = ZSTD_hash5Ptr(pBVar19,UVar1);
            break;
          case 2:
            local_798 = ZSTD_hash6Ptr(pBVar19,UVar1);
            break;
          case 3:
            local_798 = ZSTD_hash7Ptr(pBVar19,UVar1);
            break;
          case 4:
            local_798 = ZSTD_hash8Ptr(pBVar19,UVar1);
          }
          pUVar6[local_798] = (int)pBVar19 - iVar10;
          if (curr_2 != 0) {
            while( true ) {
              UVar12 = curr_2;
              bVar25 = false;
              if (ip1_2 <= pBVar18) {
                UVar13 = MEM_read32(ip1_2);
                UVar15 = MEM_read32(ip1_2 + -(ulong)curr_2);
                bVar25 = UVar13 == UVar15;
              }
              if (!bVar25) break;
              sVar22 = ZSTD_count(ip1_2 + 4,ip1_2 + 4 + -(ulong)curr_2,pBVar17);
              curr_2 = offsetSaved_2;
              offsetSaved_2 = UVar12;
              switch(0x272002) {
              case 0:
                local_7b0 = ZSTD_hash4Ptr(ip1_2,UVar1);
                break;
              case 1:
                local_7b0 = ZSTD_hash5Ptr(ip1_2,UVar1);
                break;
              case 2:
                local_7b0 = ZSTD_hash6Ptr(ip1_2,UVar1);
                break;
              case 3:
                local_7b0 = ZSTD_hash7Ptr(ip1_2,UVar1);
                break;
              case 4:
                local_7b0 = ZSTD_hash8Ptr(ip1_2,UVar1);
              }
              pUVar6[local_7b0] = (int)ip1_2 - iVar10;
              if (pBVar17 + -0x20 < ip1_2) {
                ZSTD_safecopyLiterals(seqStore->lit,ip1_2,ip1_2,pBVar17 + -0x20);
              }
              else {
                ZSTD_copy16(seqStore->lit,ip1_2);
              }
              seqStore->lit = seqStore->lit;
              seqStore->sequences->litLength = 0;
              seqStore->sequences->offset = 1;
              if (0xffff < sVar22 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->matchLength = (U16)(sVar22 + 1);
              seqStore->sequences = seqStore->sequences + 1;
              ip1_2 = ip1_2 + sVar22 + 4;
            }
          }
        }
        anchor_2 = ip1_2 + 1;
        _prefixStartIndex_2 = ip1_2;
      }
    }
    if (offsetSaved_2 == 0) {
      local_c28 = windowLow_2;
    }
    else {
      local_c28 = offsetSaved_2;
    }
    *rep = local_c28;
    if (curr_2 == 0) {
      local_c2c = windowLow_2;
    }
    else {
      local_c2c = curr_2;
    }
    rep[1] = local_c2c;
    ms_local = (ZSTD_matchState_t *)(pBVar17 + -(long)_prefixStartIndex_2);
    break;
  case 7:
    pUVar6 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar2 = (ms->cParams).targetLength;
    uVar3 = (ms->cParams).targetLength;
    pBVar7 = (ms->window).base;
    iVar10 = (int)pBVar7;
    UVar11 = ZSTD_getLowestPrefixIndex(ms,(iVar9 - iVar10) + iVar8,(ms->cParams).windowLog);
    pBVar17 = (BYTE *)((long)src + srcSize);
    pBVar18 = pBVar17 + -8;
    uVar4 = *rep;
    uVar5 = rep[1];
    windowLow_3 = 0;
    ip1_3 = (BYTE *)((long)src + (long)(int)(uint)((BYTE *)src == pBVar7 + UVar11));
    anchor_3 = ip1_3 + 1;
    UVar12 = (int)ip1_3 - iVar10;
    UVar13 = ZSTD_getLowestPrefixIndex(ms,UVar12,(ms->cParams).windowLog);
    uVar14 = UVar12 - UVar13;
    curr_3 = uVar5;
    if (uVar14 < uVar5) {
      curr_3 = 0;
      windowLow_3 = uVar5;
    }
    offsetSaved_3 = uVar4;
    _prefixStartIndex_3 = (BYTE *)src;
    if (uVar14 < uVar4) {
      offsetSaved_3 = 0;
      windowLow_3 = uVar4;
    }
    while (anchor_3 < pBVar18) {
      pBVar19 = ip1_3 + 2;
      switch(0x2727ea) {
      case 0:
        local_8f0 = ZSTD_hash4Ptr(ip1_3,UVar1);
        break;
      case 1:
        local_8f0 = ZSTD_hash5Ptr(ip1_3,UVar1);
        break;
      case 2:
        local_8f0 = ZSTD_hash6Ptr(ip1_3,UVar1);
        break;
      case 3:
        local_8f0 = ZSTD_hash7Ptr(ip1_3,UVar1);
        break;
      case 4:
        local_8f0 = ZSTD_hash8Ptr(ip1_3,UVar1);
      }
      UVar12 = MEM_read32(ip1_3);
      switch(0x2728e5) {
      case 0:
        local_908 = ZSTD_hash4Ptr(anchor_3,UVar1);
        break;
      case 1:
        local_908 = ZSTD_hash5Ptr(anchor_3,UVar1);
        break;
      case 2:
        local_908 = ZSTD_hash6Ptr(anchor_3,UVar1);
        break;
      case 3:
        local_908 = ZSTD_hash7Ptr(anchor_3,UVar1);
        break;
      case 4:
        local_908 = ZSTD_hash8Ptr(anchor_3,UVar1);
      }
      UVar13 = MEM_read32(anchor_3);
      uVar14 = (int)ip1_3 - iVar10;
      uVar4 = pUVar6[local_8f0];
      uVar5 = pUVar6[local_908];
      pBVar20 = pBVar19 + -(ulong)offsetSaved_3;
      match1_3 = pBVar7 + uVar4;
      pUVar6[local_8f0] = uVar14;
      pUVar6[local_908] = (int)anchor_3 - iVar10;
      UVar15 = MEM_read32(pBVar20);
      UVar16 = MEM_read32(pBVar19);
      if (offsetSaved_3 == 0 || UVar15 != UVar16) {
        if ((UVar11 < uVar4) && (UVar15 = MEM_read32(match1_3), UVar15 == UVar12)) {
LAB_00272b9f:
          curr_3 = offsetSaved_3;
          offsetSaved_3 = (int)ip1_3 - (int)match1_3;
          step_3._4_4_ = offsetSaved_3 + 2;
          ip2_3 = (BYTE *)0x4;
          while( true ) {
            bVar25 = false;
            if (_prefixStartIndex_3 < ip1_3 && pBVar7 + UVar11 < match1_3) {
              bVar25 = ip1_3[-1] == match1_3[-1];
            }
            if (!bVar25) break;
            ip1_3 = ip1_3 + -1;
            match1_3 = match1_3 + -1;
            ip2_3 = ip2_3 + 1;
          }
          goto LAB_00272c81;
        }
        if ((UVar11 < uVar5) && (UVar12 = MEM_read32(pBVar7 + uVar5), UVar12 == UVar13)) {
          ip1_3 = anchor_3;
          match1_3 = pBVar7 + uVar5;
          goto LAB_00272b9f;
        }
        lVar21 = ((ulong)((long)ip1_3 - (long)_prefixStartIndex_3) >> 7) +
                 (ulong)(uVar2 + ((uVar3 != 0 ^ 0xffU) & 1) + 1);
        ip1_3 = ip1_3 + lVar21;
        anchor_3 = anchor_3 + lVar21;
      }
      else {
        lVar21 = (long)(int)(uint)(ip1_3[1] == pBVar20[-1]);
        ip1_3 = pBVar19 + -lVar21;
        match1_3 = pBVar20 + -lVar21;
        ip2_3 = (BYTE *)(lVar21 + 4);
        step_3._4_4_ = 0;
LAB_00272c81:
        sVar22 = ZSTD_count(ip1_3 + (long)ip2_3,match1_3 + (long)ip2_3,pBVar17);
        pBVar19 = ip2_3 + sVar22;
        uVar24 = (long)ip1_3 - (long)_prefixStartIndex_3;
        if (pBVar17 + -0x20 < _prefixStartIndex_3 + uVar24) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_prefixStartIndex_3,_prefixStartIndex_3 + uVar24,pBVar17 + -0x20)
          ;
        }
        else {
          ZSTD_copy16(seqStore->lit,_prefixStartIndex_3);
          if (0x10 < uVar24) {
            pBVar20 = seqStore->lit;
            pBVar23 = pBVar20 + 0x10;
            ZSTD_copy16(pBVar23,_prefixStartIndex_3 + 0x10);
            if (0x10 < (long)(uVar24 - 0x10)) {
              oend_6 = pBVar20 + 0x20;
              do {
                op_6 = _prefixStartIndex_3 + 0x20;
                ZSTD_copy16(oend_6,op_6);
                ZSTD_copy16(oend_6 + 0x10,_prefixStartIndex_3 + 0x30);
                oend_6 = oend_6 + 0x20;
                _prefixStartIndex_3 = op_6;
              } while (oend_6 < pBVar23 + (uVar24 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar24;
        if (0xffff < uVar24) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar24;
        seqStore->sequences->offset = step_3._4_4_ + 1;
        if ((BYTE *)0xffff < pBVar19 + -3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(pBVar19 + -3);
        seqStore->sequences = seqStore->sequences + 1;
        ip1_3 = pBVar19 + (long)ip1_3;
        if (ip1_3 <= pBVar18) {
          pBVar19 = pBVar7 + (ulong)uVar14 + 2;
          switch(0x273153) {
          case 0:
            local_920 = ZSTD_hash4Ptr(pBVar19,UVar1);
            break;
          case 1:
            local_920 = ZSTD_hash5Ptr(pBVar19,UVar1);
            break;
          case 2:
            local_920 = ZSTD_hash6Ptr(pBVar19,UVar1);
            break;
          case 3:
            local_920 = ZSTD_hash7Ptr(pBVar19,UVar1);
            break;
          case 4:
            local_920 = ZSTD_hash8Ptr(pBVar19,UVar1);
          }
          pUVar6[local_920] = uVar14 + 2;
          pBVar19 = ip1_3 + -2;
          switch(0x273267) {
          case 0:
            local_938 = ZSTD_hash4Ptr(pBVar19,UVar1);
            break;
          case 1:
            local_938 = ZSTD_hash5Ptr(pBVar19,UVar1);
            break;
          case 2:
            local_938 = ZSTD_hash6Ptr(pBVar19,UVar1);
            break;
          case 3:
            local_938 = ZSTD_hash7Ptr(pBVar19,UVar1);
            break;
          case 4:
            local_938 = ZSTD_hash8Ptr(pBVar19,UVar1);
          }
          pUVar6[local_938] = (int)pBVar19 - iVar10;
          if (curr_3 != 0) {
            while( true ) {
              UVar12 = curr_3;
              bVar25 = false;
              if (ip1_3 <= pBVar18) {
                UVar13 = MEM_read32(ip1_3);
                UVar15 = MEM_read32(ip1_3 + -(ulong)curr_3);
                bVar25 = UVar13 == UVar15;
              }
              if (!bVar25) break;
              sVar22 = ZSTD_count(ip1_3 + 4,ip1_3 + 4 + -(ulong)curr_3,pBVar17);
              curr_3 = offsetSaved_3;
              offsetSaved_3 = UVar12;
              switch(0x273440) {
              case 0:
                local_950 = ZSTD_hash4Ptr(ip1_3,UVar1);
                break;
              case 1:
                local_950 = ZSTD_hash5Ptr(ip1_3,UVar1);
                break;
              case 2:
                local_950 = ZSTD_hash6Ptr(ip1_3,UVar1);
                break;
              case 3:
                local_950 = ZSTD_hash7Ptr(ip1_3,UVar1);
                break;
              case 4:
                local_950 = ZSTD_hash8Ptr(ip1_3,UVar1);
              }
              pUVar6[local_950] = (int)ip1_3 - iVar10;
              if (pBVar17 + -0x20 < ip1_3) {
                ZSTD_safecopyLiterals(seqStore->lit,ip1_3,ip1_3,pBVar17 + -0x20);
              }
              else {
                ZSTD_copy16(seqStore->lit,ip1_3);
              }
              seqStore->lit = seqStore->lit;
              seqStore->sequences->litLength = 0;
              seqStore->sequences->offset = 1;
              if (0xffff < sVar22 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->matchLength = (U16)(sVar22 + 1);
              seqStore->sequences = seqStore->sequences + 1;
              ip1_3 = ip1_3 + sVar22 + 4;
            }
          }
        }
        anchor_3 = ip1_3 + 1;
        _prefixStartIndex_3 = ip1_3;
      }
    }
    if (offsetSaved_3 == 0) {
      local_ca0 = windowLow_3;
    }
    else {
      local_ca0 = offsetSaved_3;
    }
    *rep = local_ca0;
    if (curr_3 == 0) {
      local_ca4 = windowLow_3;
    }
    else {
      local_ca4 = curr_3;
    }
    rep[1] = local_ca4;
    ms_local = (ZSTD_matchState_t *)(pBVar17 + -(long)_prefixStartIndex_3);
  }
  return (size_t)ms_local;
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState == NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}